

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_ordinaryFunction_directApply
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  sysbvm_functionEntryPoint_t p_Var1;
  int iVar2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_stackFrameRecord_t local_50;
  size_t local_40;
  sysbvm_tuple_t *local_38;
  
  uVar3 = *(ulong *)(function + 0x50);
  if (uVar3 != 0) {
    if (sysbvm_primitiveTableIsComputed == '\0') {
      sysbvm_primitiveTableIsComputed = '\x01';
      sysbvm_context_registerPrimitives();
      uVar3 = *(ulong *)(function + 0x50);
    }
    if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
      iVar2 = (int)(uVar3 >> 4);
    }
    else {
      iVar2 = *(int *)(uVar3 + 0x10);
    }
    if (iVar2 - 1U < sysbvm_primitiveTableSize) {
      p_Var1 = sysbvm_primitiveTable[iVar2 - 1U].entryPoint;
      local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_40 = argumentCount;
      local_38 = arguments;
      sysbvm_stackFrame_pushRecord(&local_50);
      sVar4 = (*p_Var1)(context,function,argumentCount,arguments);
      sysbvm_stackFrame_popRecord(&local_50);
      return sVar4;
    }
  }
  if (*(long *)(function + 0x48) == 0) {
    sysbvm_error("Cannot apply a function without a proper definition.");
  }
  if (*(long *)(*(long *)(function + 0x48) + 0x80) != 0) {
    sVar4 = sysbvm_bytecodeInterpreter_apply(context,function,argumentCount,arguments);
    return sVar4;
  }
  sVar4 = sysbvm_interpreter_applyClosureASTFunction
                    (context,function,argumentCount,arguments,applicationFlags);
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_directApply(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;

    // Find the entry point in the primitive table.
    if(functionObject->primitiveTableIndex)
    {
        sysbvm_primitiveTable_ensureIsComputed();
        uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(functionObject->primitiveTableIndex);
        if(primitiveNumber > 0 && primitiveNumber <= sysbvm_primitiveTableSize)
            return sysbvm_ordinaryFunction_nativeApply(context, function, sysbvm_primitiveTable[primitiveNumber - 1].entryPoint, argumentCount, arguments, applicationFlags);
    }
    
    if(!functionObject->definition)
        sysbvm_error("Cannot apply a function without a proper definition.");

    // Attempt to use the bytecode.
    sysbvm_functionDefinition_t *definition = (sysbvm_functionDefinition_t*)functionObject->definition;
    if(sysbvm_function_useBytecodeInterpreter && definition->bytecode)
        return sysbvm_bytecodeInterpreter_apply(context, function, argumentCount, arguments);
    
    return sysbvm_interpreter_applyClosureASTFunction(context, function, argumentCount, arguments, applicationFlags);
}